

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::QWidgetPrivate(QWidgetPrivate *this,QtPrivate_6_10_0 version)

{
  long in_FS_OFFSET;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,version);
  *(undefined ***)this = &PTR__QWidgetPrivate_007f5608;
  (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
  super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
  super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl = (QWExtra *)0x0;
  this->focus_next = (QWidget *)0x0;
  this->focus_prev = (QWidget *)0x0;
  this->focus_child = (QWidget *)0x0;
  this->layout = (QLayout *)0x0;
  this->needsFlush = (QRegion *)0x0;
  this->redirectDev = (QPaintDevice *)0x0;
  this->widgetItem = (QWidgetItemV2 *)0x0;
  this->extraPaintEngine = (QPaintEngine *)0x0;
  this->polished = (QMetaObject *)0x0;
  *(undefined8 *)((long)&this->polished + 4) = 0;
  *(undefined8 *)((long)&this->graphicsEffect + 4) = 0;
  QRegion::QRegion(&this->opaqueChildren);
  QRegion::QRegion(&this->dirty);
  (this->toolTip).d.size = 0;
  (this->toolTip).d.d = (Data *)0x0;
  (this->toolTip).d.ptr = (char16_t *)0x0;
  this->toolTipDuration = -1;
  this->hd = (HANDLE)0x0;
  (this->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
  super_QFlagsStorage<Qt::WindowType>.i = 0;
  memset(&this->statusTip,0,0x9c);
  (this->data).crect.x1 = 0;
  (this->data).crect.y1 = 0;
  (this->data).crect.x2 = -1;
  (this->data).crect.y2 = -1;
  QPalette::QPalette(&(this->data).pal);
  QFont::QFont(&(this->data).fnt);
  (this->data).wrect.x1 = 0;
  (this->data).wrect.y1 = 0;
  (this->data).wrect.x2 = -1;
  (this->data).wrect.y2 = -1;
  (this->size_policy).field_0.data = 0x550000;
  QLocale::QLocale(&this->locale);
  (this->gestureContext).d.d.ptr =
       (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
        *)0x0;
  (this->actions).d.ptr = (QAction **)0x0;
  (this->actions).d.size = 0;
  (this->redirectOffset).xp = 0;
  (this->redirectOffset).yp = 0;
  (this->actions).d.d = (Data *)0x0;
  *(undefined4 *)&this->field_0x250 = 0x8011111;
  if (QCoreApplication::self == 0) {
    QWidgetPrivate((QWidgetPrivate *)&stack0xffffffffffffffc8);
  }
  else {
    this->field_0x31 = this->field_0x31 | 2;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      this->high_attributes[0] = 0;
      this->high_attributes[1] = 0;
      this->high_attributes[2] = 0;
      this->high_attributes[3] = 0;
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

QWidgetPrivate::QWidgetPrivate(decltype(QObjectPrivateVersion) version)
    : QObjectPrivate(version)
      , focus_next(nullptr)
      , focus_prev(nullptr)
      , focus_child(nullptr)
      , layout(nullptr)
      , needsFlush(nullptr)
      , redirectDev(nullptr)
      , widgetItem(nullptr)
      , extraPaintEngine(nullptr)
      , polished(nullptr)
      , graphicsEffect(nullptr)
#if !defined(QT_NO_IM)
      , imHints(Qt::ImhNone)
#endif
#if QT_CONFIG(tooltip)
      , toolTipDuration(-1)
#endif
      , directFontResolveMask(0)
      , inheritedFontResolveMask(0)
      , directPaletteResolveMask(0)
      , inheritedPaletteResolveMask(0)
      , leftmargin(0)
      , topmargin(0)
      , rightmargin(0)
      , bottommargin(0)
      , leftLayoutItemMargin(0)
      , topLayoutItemMargin(0)
      , rightLayoutItemMargin(0)
      , bottomLayoutItemMargin(0)
      , hd(nullptr)
      , size_policy(QSizePolicy::Preferred, QSizePolicy::Preferred)
      , fg_role(QPalette::NoRole)
      , bg_role(QPalette::NoRole)
      , dirtyOpaqueChildren(1)
      , isOpaque(0)
      , retainSizeWhenHiddenChanged(0)
      , inDirtyList(0)
      , isScrolled(0)
      , isMoved(0)
      , usesDoubleBufferedGLContext(0)
      , mustHaveWindowHandle(0)
      , renderToTexture(0)
      , textureChildSeen(0)
#ifndef QT_NO_IM
      , inheritsInputMethodHints(0)
#endif
      , renderToTextureReallyDirty(1)
      , usesRhiFlush(0)
      , childrenHiddenByWState(0)
      , childrenShownByExpose(0)
      , dontSetExplicitShowHide(0)
#if defined(Q_OS_WIN)
      , noPaintOnScreen(0)
#endif
{
    if (Q_UNLIKELY(!qApp)) {
        qFatal("QWidget: Must construct a QApplication before a QWidget");
        return;
    }

    willBeWidget = true; // used in QObject's ctor
    memset(high_attributes, 0, sizeof(high_attributes));

#ifdef QWIDGET_EXTRA_DEBUG
    static int count = 0;
    qDebug() << "widgets" << ++count;
#endif
}